

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

int bit_tohex(lua_State *L)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar5;
  uint uVar6;
  size_t len;
  uint uVar7;
  char *pcVar8;
  char buf [8];
  char acStack_18 [8];
  lua_Integer lVar4;
  
  uVar3 = luaL_checkinteger(L,1);
  iVar1 = lua_type(L,2);
  if (iVar1 == -1) {
    uVar2 = 8;
  }
  else {
    lVar4 = luaL_checkinteger(L,2);
    uVar2 = (uint)lVar4;
  }
  pcVar5 = "0123456789abcdef";
  if ((int)uVar2 < 0) {
    pcVar5 = "0123456789ABCDEF";
  }
  if (uVar2 != 0) {
    uVar6 = -uVar2;
    if (0 < (int)uVar2) {
      uVar6 = uVar2;
    }
    uVar7 = 8;
    if ((int)uVar6 < 8) {
      uVar7 = uVar6;
    }
    iVar1 = uVar7 + 1;
    pcVar8 = acStack_18 + (uVar7 - 1);
    do {
      *pcVar8 = pcVar5[(uint)uVar3 & 0xf];
      uVar3 = (ulong)((uint)uVar3 >> 4);
      iVar1 = iVar1 + -1;
      pcVar8 = pcVar8 + -1;
    } while (1 < iVar1);
  }
  uVar6 = -uVar2;
  if (0 < (int)uVar2) {
    uVar6 = uVar2;
  }
  len = 8;
  if ((int)uVar6 < 8) {
    len = (size_t)uVar6;
  }
  lua_pushlstring(L,acStack_18,len);
  return 1;
}

Assistant:

static int bit_tohex(lua_State *L)
{
  UBits b = barg(L, 1);
  SBits n = lua_isnone(L, 2) ? 8 : (SBits)barg(L, 2);
  const char *hexdigits = "0123456789abcdef";
  char buf[8];
  int i;
  if (n < 0) { n = -n; hexdigits = "0123456789ABCDEF"; }
  if (n > 8) n = 8;
  for (i = (int)n; --i >= 0; ) { buf[i] = hexdigits[b & 15]; b >>= 4; }
  lua_pushlstring(L, buf, (size_t)n);
  return 1;
}